

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void __thiscall
ot::commissioner::DtlsSession::HandleMbedtlsExportKeys
          (DtlsSession *this,mbedtls_ssl_key_export_type aType,uchar *aMasterSecret,
          size_t aMasterSecretLen,uchar *aClientRandom,uchar *aServerRandom,
          mbedtls_tls_prf_types aTlsPrfType)

{
  bool bVar1;
  uchar *aHash;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar2;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_222;
  v10 local_221;
  v10 *local_220;
  size_t local_218;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  undefined8 uStack_1b8;
  uchar randBytes [64];
  uchar keyBlock [40];
  undefined1 local_144 [8];
  Sha256 sha256;
  uchar *aServerRandom_local;
  uchar *aClientRandom_local;
  size_t aMasterSecretLen_local;
  uchar *aMasterSecret_local;
  mbedtls_ssl_key_export_type aType_local;
  DtlsSession *this_local;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  DtlsSession **local_38;
  undefined1 *local_30;
  DtlsSession **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  DtlsSession **local_10;
  
  sha256.mContext._100_8_ = aServerRandom;
  Sha256::Sha256((Sha256 *)local_144);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->mPSK);
  if ((!bVar1) && (aType == MBEDTLS_SSL_KEY_EXPORT_TLS12_MASTER_SECRET)) {
    uStack_1b8 = *(undefined8 *)sha256.mContext._100_8_;
    randBytes._0_8_ = *(undefined8 *)(sha256.mContext._100_8_ + 8);
    randBytes._8_8_ = *(undefined8 *)(sha256.mContext._100_8_ + 0x10);
    randBytes._16_8_ = *(undefined8 *)(sha256.mContext._100_8_ + 0x18);
    randBytes._24_8_ = *(undefined8 *)aClientRandom;
    randBytes._32_8_ = *(undefined8 *)(aClientRandom + 8);
    randBytes._40_8_ = *(undefined8 *)(aClientRandom + 0x10);
    randBytes._48_8_ = *(undefined8 *)(aClientRandom + 0x18);
    aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
             )0x40;
    mbedtls_ssl_tls_prf(aTlsPrfType,aMasterSecret,aMasterSecretLen,"key expansion",
                        (uchar *)&uStack_1b8,0x40,randBytes + 0x38,0x28);
    Sha256::Start((Sha256 *)local_144);
    Sha256::Update((Sha256 *)local_144,randBytes + 0x38,0x28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->mKek,0x20);
    aHash = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->mKek);
    Sha256::Finish((Sha256 *)local_144,aHash);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->mKek,0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"dtls",&local_1e9);
    HandleMbedtlsExportKeys::anon_class_1_0_00000001::operator()(&local_222);
    local_58 = &local_220;
    local_60 = &local_221;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_218 = bVar3.size_;
    local_220 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_210;
    local_78 = local_220;
    sStack_70 = local_218;
    local_50 = &local_78;
    local_88 = local_220;
    local_80 = local_218;
    local_48 = local_88;
    sStack_40 = local_80;
    this_local = (DtlsSession *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &this_local;
    local_20 = 0;
    args.field_1.values_ = aVar2.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_210,local_88,fmt,args);
    Log(kDebug,&local_1e8,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  Sha256::~Sha256((Sha256 *)local_144);
  return;
}

Assistant:

void DtlsSession::HandleMbedtlsExportKeys(mbedtls_ssl_key_export_type aType,
                                          const unsigned char        *aMasterSecret,
                                          size_t                      aMasterSecretLen,
                                          const unsigned char         aClientRandom[32],
                                          const unsigned char         aServerRandom[32],
                                          mbedtls_tls_prf_types       aTlsPrfType)
{
    Sha256        sha256;
    unsigned char keyBlock[kKeyBlockSize];
    unsigned char randBytes[2 * kRandomBufferSize];

    VerifyOrExit(!mPSK.empty());
    VerifyOrExit(aType == MBEDTLS_SSL_KEY_EXPORT_TLS12_MASTER_SECRET);

    memcpy(randBytes, aServerRandom, kRandomBufferSize);
    memcpy(randBytes + kRandomBufferSize, aClientRandom, kRandomBufferSize);

    // Retrieve the Key block from Master secret
    mbedtls_ssl_tls_prf(aTlsPrfType, aMasterSecret, aMasterSecretLen, "key expansion", randBytes, sizeof(randBytes),
                        keyBlock, sizeof(keyBlock));

    sha256.Start();
    sha256.Update(keyBlock, kKeyBlockSize);

    mKek.resize(Sha256::kHashSize);
    sha256.Finish(mKek.data());

    static_assert(Sha256::kHashSize >= kJoinerRouterKekLength, "Sha256::kHashSize >= kJoinerRouterKekLength");
    mKek.resize(kJoinerRouterKekLength);

    LOG_DEBUG(LOG_REGION_DTLS, "Generated KEK");

exit:;
}